

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O2

void __thiscall HVectorBase<double>::setup(HVectorBase<double> *this,HighsInt size_)

{
  value_type local_1d;
  value_type_conflict2 local_1c;
  value_type_conflict1 local_18;
  
  this->size = size_;
  this->count = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->index,(long)size_);
  local_18 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->array,(long)this->size,&local_18);
  local_1d = '\0';
  std::vector<char,_std::allocator<char>_>::_M_fill_assign
            (&this->cwork,(long)this->size + 0x1900,&local_1d);
  local_1c = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->iwork,(long)this->size << 2,&local_1c);
  this->packCount = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->packIndex,(long)this->size);
  std::vector<double,_std::allocator<double>_>::resize(&this->packValue,(long)this->size);
  this->packFlag = false;
  this->synthetic_tick = 0.0;
  this->next = (HVectorBase<double> *)0x0;
  return;
}

Assistant:

void HVectorBase<Real>::setup(HighsInt size_) {
  /*
   * Initialise an HVector instance
   */
  size = size_;
  count = 0;
  index.resize(size);
  array.assign(size, Real{0});
  cwork.assign(size + 6400, 0);  // MAX invert
  iwork.assign(size * 4, 0);

  packCount = 0;
  packIndex.resize(size);
  packValue.resize(size);

  // Initialise three values that are initialised in clear(), but
  // weren't originally initialised in setup(). Probably doesn't
  // matter, since clear() is usually called before a vector is
  // (re-)used.
  packFlag = false;
  synthetic_tick = 0;
  next = 0;
}